

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  istream *this;
  long *plVar2;
  bool bVar3;
  int b;
  int a;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> v;
  int local_74;
  int local_70;
  int local_6c;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_68;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  pair<int,_int> local_30;
  
  local_68.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::operator>>((istream *)&std::cin,&local_74);
  bVar3 = local_74 != 0;
  local_74 = local_74 + -1;
  if (bVar3) {
    do {
      this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_6c);
      std::istream::operator>>(this,&local_70);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_68,
                 &local_30);
      bVar3 = local_74 != 0;
      local_74 = local_74 + -1;
    } while (bVar3);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_48,&local_68);
  iVar1 = eval_postfix(&local_48);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    vector<pair<int, int>> v;
    int n, a, b;
    cin >> n;
    while (n--) {
        cin >> a >> b;
        v.push_back(make_pair(a, b));
    }
    cout << eval_postfix(v) << endl;
}